

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O1

upb_MiniTableEnum *
upb_MiniTableEnum_Build(char *data,size_t len,upb_Arena *arena,upb_Status *status)

{
  upb_MiniTableEnum *puVar1;
  upb_MdEnumDecoder decoder;
  upb_MdEnumDecoder local_120;
  
  memset(&local_120,0,0xf8);
  local_120.base.end = data + len;
  local_120.enum_table = (upb_MiniTableEnum *)arena->ptr_dont_copy_me__upb_internal_use_only;
  local_120.base.status = status;
  local_120.arena = arena;
  if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)local_120.enum_table) <
      0x10) {
    local_120.enum_table =
         (upb_MiniTableEnum *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x10);
  }
  else {
    if ((upb_MiniTableEnum *)
        ((ulong)((long)&(local_120.enum_table)->value_count_dont_copy_me__upb_internal_use_only + 3U
                ) & 0xfffffffffffffff8) != local_120.enum_table) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(local_120.enum_table + 2);
  }
  local_120.enum_data_capacity = 2;
  puVar1 = upb_MtDecoder_BuildMiniTableEnum(&local_120,data,len);
  return puVar1;
}

Assistant:

upb_MiniTableEnum* upb_MiniTableEnum_Build(const char* data, size_t len,
                                           upb_Arena* arena,
                                           upb_Status* status) {
  uint32_t initial_capacity = 2;
  upb_MdEnumDecoder decoder = {
      .base =
          {
              .end = UPB_PTRADD(data, len),
              .status = status,
          },
      .arena = arena,
      .enum_table =
          upb_Arena_Malloc(arena, upb_MiniTableEnum_Size(initial_capacity)),
      .enum_value_count = 0,
      .enum_data_count = 0,
      .enum_data_capacity = initial_capacity,
  };

  return upb_MtDecoder_BuildMiniTableEnum(&decoder, data, len);
}